

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

void __thiscall IMLE::clusterInverseSolutions(IMLE *this,int newSol1,int newSol2,int worseSol)

{
  int *y;
  Index *pIVar1;
  pointer pMVar2;
  ulong uVar3;
  int k_1;
  int k;
  long lVar4;
  long lVar5;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *pPVar6;
  int j;
  long lVar7;
  ResScalar RVar8;
  double dVar9;
  Mat p;
  Mat sol;
  ArrayZZ sum_invRp;
  Scal pSum;
  void *local_128;
  Matrix<double,_1,_1,0,_1,_1> *local_120;
  void *local_118;
  undefined1 local_110 [24];
  Matrix<double,_1,_1,0,_1,_1> *local_f8;
  variable_if_dynamic<long,__1> local_f0;
  variable_if_dynamic<long,__1> local_e8;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_e0;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_d8;
  Matrix<double,_1,_1,0,_1,_1> *local_d0;
  int *local_c8;
  void *local_c0;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_b8;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_a8;
  long local_a0;
  int *local_98;
  ulong local_90;
  void **local_88;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_80;
  void *local_68;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_60;
  void **local_50;
  undefined8 local_48;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_40;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_38;
  
  local_a0 = CONCAT44(local_a0._4_4_,worseSol);
  local_98 = &this->M;
  y = &this->nInvSolFound;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_128,local_98,y);
  local_c8 = y;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_c0,&this->d,y);
  local_a8 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)CONCAT44(local_a8._4_4_,newSol2);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector(&local_80,(long)this->nInvSolFound,&this->zeroZZ,(allocator_type *)local_110);
  lVar7 = 0;
  for (lVar4 = 0; local_f8 = (Matrix<double,_1,_1,0,_1,_1> *)&local_c0, lVar4 < (long)*local_c8 + -1
      ; lVar4 = lVar4 + 1) {
    local_110._0_8_ = (long)local_b8 * lVar4 * 8 + (long)local_c0;
    local_110._8_8_ = local_b8;
    local_f0.m_value = 0;
    local_e0 = local_b8;
    local_e8.m_value = lVar4;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_110,
               (Matrix<double,__1,_1,_0,__1,_1> *)
               ((long)&(((this->invPredictions).
                         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                       m_data + lVar7));
    lVar7 = lVar7 + 0x10;
  }
  local_e8.m_value = (long)(int)local_a0;
  local_110._0_8_ = (long)local_b8 * local_e8.m_value * 8 + (long)local_c0;
  local_110._8_8_ = local_b8;
  local_f0.m_value = 0;
  local_e0 = local_b8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_110,
             &(this->experts).
              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              .
              super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              ._M_impl.super__Vector_impl_data._M_start[newSol1].super_LinearExpert.pred_z);
  local_e8.m_value = (long)this->nInvSolFound + -1;
  local_110._0_8_ = (long)local_b8 * local_e8.m_value * 8 + (long)local_c0;
  local_110._8_8_ = local_b8;
  local_f0.m_value = 0;
  local_e0 = local_b8;
  local_f8 = (Matrix<double,_1,_1,0,_1,_1> *)&local_c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_110,
             &(this->experts).
              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              .
              super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)local_a8].super_LinearExpert.pred_z);
  local_a8 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->invRzj;
  uVar3 = 0;
  while ((int)uVar3 < (this->param).iterMax) {
    lVar4 = 0;
    local_90 = uVar3;
    while( true ) {
      if (*local_98 <= lVar4) break;
      local_a0 = lVar4 * 0x308;
      for (lVar7 = 0; lVar7 < *local_c8; lVar7 = lVar7 + 1) {
        local_110._8_8_ = (long)local_b8 * lVar7 * 8 + (long)local_c0;
        local_110._0_8_ =
             (long)&(((this->experts).
                      super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      .
                      super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).pred_z +
             local_a0;
        local_110._16_8_ = local_b8;
        local_f0.m_value = (long)&local_c0;
        local_e8.m_value = 0;
        local_d8 = local_b8;
        local_e0 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)lVar7;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_68,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                    *)local_110);
        local_110._0_8_ =
             (this->iInvRj).
             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4;
        local_110._8_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_68;
        RVar8 = Eigen::internal::
                dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_false>
                ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_68,
                      (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                       *)local_110);
        dVar9 = exp((RVar8 * -0.5) / this->sumAll);
        *(double *)((long)local_128 + lVar4 * 8 + (long)local_120 * lVar7 * 8) = dVar9;
        free(local_68);
      }
      local_110._0_8_ = (long)local_128 + lVar4 * 8;
      local_110._16_8_ = local_118;
      local_e8.m_value = 0;
      local_e0 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)0x1;
      local_f8 = (Matrix<double,_1,_1,0,_1,_1> *)&local_128;
      local_f0.m_value = lVar4;
      local_68 = (void *)Eigen::
                         DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
                         ::sum((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                                *)local_110);
      if (0.0 < (double)local_68) {
        local_110._0_8_ = lVar4 * 8 + (long)local_128;
        local_110._16_8_ = local_118;
        local_e8.m_value = 0;
        local_e0 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)0x1;
        local_f8 = (Matrix<double,_1,_1,0,_1,_1> *)&local_128;
        local_f0.m_value = lVar4;
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
        operator/=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *)local_110,(Scalar *)&local_68);
      }
      lVar5 = 0;
      for (lVar7 = 0; lVar7 < *local_c8; lVar7 = lVar7 + 1) {
        pMVar2 = (this->iInvRj).
                 super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_110._0_8_ = pMVar2 + lVar4;
        local_f8 = *(Matrix<double,_1,_1,0,_1,_1> **)
                    ((long)local_128 + lVar4 * 8 + (long)local_120 * lVar7 * 8);
        pIVar1 = &pMVar2[lVar4].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
        local_110._8_8_ = *pIVar1;
        local_110._16_8_ = pIVar1[1];
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                   ((long)&((local_80.
                             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_data + lVar5),
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)local_110);
        lVar5 = lVar5 + 0x18;
      }
      lVar4 = lVar4 + 1;
    }
    lVar4 = 0;
    for (pPVar6 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)0x0;
        (long)pPVar6 < (long)*local_c8; pPVar6 = pPVar6 + 1) {
      local_110._16_8_ = (long)local_120 * (long)pPVar6 * 8 + (long)local_128;
      local_110._0_8_ =
           (long)&((local_80.
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
           + lVar4;
      local_110._8_8_ = local_a8;
      local_f8 = local_120;
      local_e0 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)0x0;
      local_68 = (void *)((long)local_b8 * (long)pPVar6 * 8 + (long)local_c0);
      local_60 = local_b8;
      local_48 = 0;
      local_d0 = local_120;
      local_38 = local_b8;
      local_e8.m_value = (long)&local_128;
      local_d8 = pPVar6;
      local_88 = &local_68;
      local_50 = &local_c0;
      local_40 = pPVar6;
      Eigen::NoAlias<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,Eigen::MatrixBase>
      ::operator=((NoAlias<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::MatrixBase>
                   *)&local_88,
                  (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_0>_>
                   *)local_110);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 ((long)&((local_80.
                           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                         .m_data + lVar4));
      lVar4 = lVar4 + 0x18;
    }
    uVar3 = (ulong)((int)local_90 + 1);
  }
  lVar5 = 0;
  lVar4 = 0;
  for (lVar7 = 0; lVar7 < *local_98; lVar7 = lVar7 + 1) {
    local_110._0_8_ = (long)local_128 + lVar4;
    local_110._16_8_ = local_118;
    local_e8.m_value = 0;
    local_e0 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)0x1;
    local_f8 = (Matrix<double,_1,_1,0,_1,_1> *)&local_128;
    local_f0.m_value = lVar7;
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::maxCoeff<0,int>
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)local_110,
               (int *)((long)(this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar4 = lVar4 + 8;
    lVar5 = lVar5 + 4;
  }
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector(&local_80);
  free(local_c0);
  free(local_128);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterInverseSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nInvSolFound);
    Mat sol(d,nInvSolFound);
    ArrayZZ sum_invRp(nInvSolFound, zeroZZ);

    // "Educated" guesses for the nInvSolFound solutions
    for(int k = 0; k < nInvSolFound-1; k++)
        sol.col(k) = invPredictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredZ();
    sol.col(nInvSolFound-1) = experts[newSol2].getPredZ();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nInvSolFound; k++ )
            {
                Z dist = experts[j].getPredZ() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(iInvRj[j]*dist)/sumAll);
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;

            for( int k = 0; k < nInvSolFound; k++ )
                sum_invRp[k] += iInvRj[j] * p(j,k);
        }
        // M-Step
        for( int k = 0; k < nInvSolFound; k++ )
        {
            /* Here I can easily implement k-means by hard assigning to most probable solution */
            sol.col(k).noalias() = sum_invRp[k].inverse() * (invRzj * p.col(k));

            // Cleaning aux variable
            sum_invRp[k].setZero();
        }
    }

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
        p.row(j).maxCoeff(&sNearestInv[j]);
}